

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void finishgencycle(lua_State *L,global_State *g)

{
  int iVar1;
  global_State *pgVar2;
  GCObject **ppGVar3;
  int iVar4;
  
  ppGVar3 = correctgraylist(&g->grayagain);
  *ppGVar3 = g->weak;
  g->weak = (GCObject *)0x0;
  ppGVar3 = correctgraylist(ppGVar3);
  *ppGVar3 = g->allweak;
  g->allweak = (GCObject *)0x0;
  ppGVar3 = correctgraylist(ppGVar3);
  *ppGVar3 = g->ephemeron;
  g->ephemeron = (GCObject *)0x0;
  correctgraylist(ppGVar3);
  if (g->gcemergency == '\0') {
    iVar1 = (g->strt).size;
    iVar4 = iVar1 + 3;
    if (-1 < iVar1) {
      iVar4 = iVar1;
    }
    if ((g->strt).nuse < iVar4 >> 2) {
      luaS_resize(L,iVar1 / 2);
    }
  }
  g->gcstate = '\0';
  if (g->gcemergency == '\0') {
    pgVar2 = L->l_G;
    while (pgVar2->tobefnz != (GCObject *)0x0) {
      GCTM(L);
    }
  }
  return;
}

Assistant:

static void finishgencycle (lua_State *L, global_State *g) {
  correctgraylists(g);
  checkSizes(L, g);
  g->gcstate = GCSpropagate;  /* skip restart */
  if (!g->gcemergency)
    callallpendingfinalizers(L);
}